

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.h
# Opt level: O0

void __thiscall
rest_rpc::rpc_service::connection::on_write(connection *this,error_code ec,size_t length)

{
  bool bVar1;
  size_t in_RCX;
  void *__buf;
  int in_ESI;
  connection *in_RDI;
  enable_shared_from_this<rest_rpc::rpc_service::connection> *in_stack_ffffffffffffff88;
  deque<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  error_code *in_stack_ffffffffffffffa8;
  function<void_(std::shared_ptr<rest_rpc::rpc_service::connection>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_ffffffffffffffb0;
  error_code *in_stack_ffffffffffffffc8;
  connection *in_stack_ffffffffffffffd0;
  error_code local_10;
  
  bVar1 = std::error_code::operator_cast_to_bool(&local_10);
  if (bVar1) {
    print(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (in_RDI->on_net_err_ !=
        (function<void_(std::shared_ptr<rest_rpc::rpc_service::connection>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
         *)0x0) {
      std::enable_shared_from_this<rest_rpc::rpc_service::connection>::shared_from_this
                (in_stack_ffffffffffffff88);
      std::error_code::message_abi_cxx11_(in_stack_ffffffffffffffa8);
      std::
      function<void_(std::shared_ptr<rest_rpc::rpc_service::connection>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::operator()(in_stack_ffffffffffffffb0,
                   (shared_ptr<rest_rpc::rpc_service::connection> *)in_stack_ffffffffffffffa8,
                   in_stack_ffffffffffffffa0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
      std::shared_ptr<rest_rpc::rpc_service::connection>::~shared_ptr
                ((shared_ptr<rest_rpc::rpc_service::connection> *)0x1ec98c);
    }
    close(in_RDI,0);
  }
  else {
    bVar1 = has_closed(in_RDI);
    if (!bVar1) {
      std::deque<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_>::pop_front
                (in_stack_ffffffffffffff90);
      bVar1 = std::deque<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_>::empty
                        ((deque<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_> *)
                         0x1eca04);
      if (!bVar1) {
        write(in_RDI,in_ESI,__buf,in_RCX);
      }
    }
  }
  return;
}

Assistant:

void on_write(asio::error_code ec, std::size_t length) {
    if (ec) {
      print(ec);
      if (on_net_err_) {
        (*on_net_err_)(shared_from_this(), ec.message());
      }
      close(false);
      return;
    }

    if (has_closed()) {
      return;
    }

    write_queue_.pop_front();

    if (!write_queue_.empty()) {
      write();
    }
  }